

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::type_is_top_level_array(Compiler *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  SPIRType *pSVar4;
  size_t sVar5;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    if (uVar2 == 0) {
      this_local._7_1_ = (bool)((type->pointer ^ 0xffU) & 1);
    }
    else {
      sVar3 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
      pSVar4 = get<spirv_cross::SPIRType>(this,uVar2);
      sVar5 = VectorView<unsigned_int>::size(&(pSVar4->array).super_VectorView<unsigned_int>);
      this_local._7_1_ = sVar5 < sVar3;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::type_is_top_level_array(const SPIRType &type) const
{
	if (type.array.empty())
		return false;

	// If we have pointer and array, we infer pointer-to-array as it's the only meaningful thing outside BDA.
	if (type.parent_type)
		return type.array.size() > get<SPIRType>(type.parent_type).array.size();
	else
		return !type.pointer;
}